

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool CheckSequenceLocksAtTip(CBlockIndex *tip,LockPoints *lock_points)

{
  pair<int,_long> lockPair;
  bool bVar1;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  CBlockIndex index;
  long *in_stack_ffffffffffffff28;
  CBlockIndex *block;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  CBlockIndex local_a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    __assert_fail("tip != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xf4,"bool CheckSequenceLocksAtTip(CBlockIndex *, const LockPoints &)");
  }
  block = &local_a0;
  CBlockIndex::CBlockIndex
            ((CBlockIndex *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  local_a0.nHeight = *(int *)(in_RDI + 0x18) + 1;
  std::pair<int,_long>::pair<int,_long,_true>
            ((pair<int,_long> *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
             (int *)block,in_stack_ffffffffffffff28);
  lockPair._7_1_ = in_stack_ffffffffffffff3f;
  lockPair._0_7_ = in_stack_ffffffffffffff38;
  lockPair.second = in_RSI;
  bVar1 = EvaluateSequenceLocks(block,lockPair);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckSequenceLocksAtTip(CBlockIndex* tip,
                             const LockPoints& lock_points)
{
    assert(tip != nullptr);

    CBlockIndex index;
    index.pprev = tip;
    // CheckSequenceLocksAtTip() uses active_chainstate.m_chain.Height()+1 to evaluate
    // height based locks because when SequenceLocks() is called within
    // ConnectBlock(), the height of the block *being*
    // evaluated is what is used.
    // Thus if we want to know if a transaction can be part of the
    // *next* block, we need to use one more than active_chainstate.m_chain.Height()
    index.nHeight = tip->nHeight + 1;

    return EvaluateSequenceLocks(index, {lock_points.height, lock_points.time});
}